

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndGroup(void)

{
  undefined8 uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiGroupData *pIVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  bool group_contains_curr_hovered_id;
  bool group_contains_prev_active_id;
  bool group_contains_curr_active_id;
  ImRect group_bb;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined5 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  ImVec2 *rhs;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  ImGuiItemFlags extra_flags;
  ImVec2 nav_bb_arg;
  ImVec2 size;
  ImVec2 in_stack_ffffffffffffffd8;
  ImVec2 local_20;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar4 = ImVector<ImGuiGroupData>::back(&GImGui->GroupStack);
  rhs = &pIVar4->BackupCursorPos;
  auVar9._0_8_ = ImMax((ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffffbf,
                                CONCAT16(in_stack_ffffffffffffffbe,
                                         CONCAT15(in_stack_ffffffffffffffbd,
                                                  in_stack_ffffffffffffffb8))),rhs);
  auVar9._8_56_ = extraout_var;
  size = (ImVec2)vmovlpd_avx(auVar9._0_16_);
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffd8,rhs,(ImVec2 *)&stack0xffffffffffffffd0);
  (pIVar2->DC).CursorPos = pIVar4->BackupCursorPos;
  auVar10._0_8_ =
       ImMax((ImVec2 *)
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,
                               CONCAT15(in_stack_ffffffffffffffbd,in_stack_ffffffffffffffb8))),rhs);
  auVar10._8_56_ = extraout_var_00;
  nav_bb_arg = (ImVec2)vmovlpd_avx(auVar10._0_16_);
  (pIVar2->DC).CursorMaxPos = nav_bb_arg;
  (pIVar2->DC).Indent.x = (pIVar4->BackupIndent).x;
  (pIVar2->DC).GroupOffset.x = (pIVar4->BackupGroupOffset).x;
  (pIVar2->DC).CurrLineSize = pIVar4->BackupCurrLineSize;
  (pIVar2->DC).CurrLineTextBaseOffset = pIVar4->BackupCurrLineTextBaseOffset;
  if ((pIVar3->LogEnabled & 1U) != 0) {
    pIVar3->LogLinePosY = -3.4028235e+38;
  }
  if ((pIVar4->EmitItem & 1U) == 0) {
    ImVector<ImGuiGroupData>::pop_back(&pIVar3->GroupStack);
  }
  else {
    fVar8 = ImMax<float>((pIVar2->DC).PrevLineTextBaseOffset,pIVar4->BackupCurrLineTextBaseOffset);
    (pIVar2->DC).CurrLineTextBaseOffset = fVar8;
    auVar11._0_8_ =
         ImRect::GetSize((ImRect *)
                         CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,
                                           CONCAT15(in_stack_ffffffffffffffad,
                                                    in_stack_ffffffffffffffa8))));
    auVar11._8_56_ = extraout_var_01;
    uVar1 = vmovlpd_avx(auVar11._0_16_);
    extra_flags = (ImGuiItemFlags)((ulong)uVar1 >> 0x20);
    ItemSize((ImVec2 *)size,nav_bb_arg.y);
    ItemAdd((ImRect *)in_stack_ffffffffffffffd8,(ImGuiID)size.y,(ImRect *)nav_bb_arg,extra_flags);
    bVar5 = false;
    if ((pIVar4->BackupActiveIdIsAlive != pIVar3->ActiveId) &&
       (bVar5 = false, pIVar3->ActiveIdIsAlive == pIVar3->ActiveId)) {
      bVar5 = pIVar3->ActiveId != 0;
    }
    bVar6 = false;
    if ((pIVar4->BackupActiveIdPreviousFrameIsAlive & 1U) == 0) {
      bVar6 = (pIVar3->ActiveIdPreviousFrameIsAlive & 1U) == 1;
    }
    if (bVar5) {
      (pIVar3->LastItemData).ID = pIVar3->ActiveId;
    }
    else if (bVar6) {
      (pIVar3->LastItemData).ID = pIVar3->ActiveIdPreviousFrame;
    }
    (pIVar3->LastItemData).Rect.Min = in_stack_ffffffffffffffd8;
    (pIVar3->LastItemData).Rect.Max = local_20;
    bVar7 = false;
    if ((pIVar4->BackupHoveredIdIsAlive & 1U) == 0) {
      bVar7 = pIVar3->HoveredId != 0;
    }
    if (bVar7) {
      (pIVar3->LastItemData).StatusFlags = (pIVar3->LastItemData).StatusFlags | 0x80;
    }
    if ((bVar5) && ((pIVar3->ActiveIdHasBeenEditedThisFrame & 1U) != 0)) {
      (pIVar3->LastItemData).StatusFlags = (pIVar3->LastItemData).StatusFlags | 4;
    }
    (pIVar3->LastItemData).StatusFlags = (pIVar3->LastItemData).StatusFlags | 0x20;
    if ((bVar6) && (pIVar3->ActiveId != pIVar3->ActiveIdPreviousFrame)) {
      (pIVar3->LastItemData).StatusFlags = (pIVar3->LastItemData).StatusFlags | 0x40;
    }
    ImVector<ImGuiGroupData>::pop_back(&pIVar3->GroupStack);
  }
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}